

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O2

void __thiscall MeCab::Param::~Param(Param *this)

{
  ~Param(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Param() {}